

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmReturnCommand.cxx
# Opt level: O0

bool cmReturnCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *pcVar3;
  const_reference pvVar4;
  PolicyID id;
  PolicyID id_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_259;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  char local_221;
  cmAlphaNum local_220;
  cmAlphaNum local_1f0;
  string local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  size_t local_190;
  char *local_188;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_180;
  string local_170;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  string local_f0;
  cmAlphaNum local_d0;
  string local_90;
  cmAlphaNum local_70;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    cmExecutionStatus::SetReturnInvoked(local_20);
  }
  else {
    pcVar3 = cmExecutionStatus::GetMakefile(local_20);
    PVar2 = cmMakefile::GetPolicyStatus(pcVar3,CMP0140,false);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        pcVar3 = cmExecutionStatus::GetMakefile(local_20);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_90,(cmPolicies *)0x8c,id);
        cmAlphaNum::cmAlphaNum(&local_70,&local_90);
        cmAlphaNum::cmAlphaNum(&local_d0,'\n');
        cmStrCat<char[153]>(&local_40,&local_70,&local_d0,
                            (char (*) [153])
                            "return() checks its arguments when the policy is set to NEW. Since the policy is not set the OLD behavior will be used so the arguments will be ignored."
                           );
        cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        if (PVar2 - REQUIRED_IF_USED < 2) {
          pcVar3 = cmExecutionStatus::GetMakefile(local_20);
          cmAlphaNum::cmAlphaNum(&local_120,'\n');
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_170,(cmPolicies *)0x8c,id_00);
          cmAlphaNum::cmAlphaNum(&local_150,&local_170);
          cmStrCat<>(&local_f0,&local_120,&local_150);
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_170);
          cmSystemTools::SetFatalErrorOccurred();
          return false;
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,0);
        local_180 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
        local_1a0 = (basic_string_view<char,_std::char_traits<char>_>)
                    cm::operator____s("PROPAGATE",9);
        local_190 = local_1a0._M_len;
        local_188 = local_1a0._M_str;
        bVar1 = std::operator!=(local_180,local_1a0);
        this = local_20;
        if (bVar1) {
          cmAlphaNum::cmAlphaNum(&local_1f0,"called with unsupported argument \"");
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,0);
          cmAlphaNum::cmAlphaNum(&local_220,pvVar4);
          local_221 = '\"';
          cmStrCat<char>(&local_1c0,&local_1f0,&local_220,&local_221);
          cmExecutionStatus::SetError(this,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          cmSystemTools::SetFatalErrorOccurred();
          return false;
        }
        local_250._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
        local_248 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_250,1);
        local_258._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_259);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
                   local_248,local_258,&local_259);
        cmExecutionStatus::SetReturnInvoked(this,&local_240);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_240);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_259);
      }
    }
  }
  return true;
}

Assistant:

bool cmReturnCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (!args.empty()) {
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0140)) {
      case cmPolicies::WARN:
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0140), '\n',
            "return() checks its arguments when the policy is set to NEW. "
            "Since the policy is not set the OLD behavior will be used so "
            "the arguments will be ignored."));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat('\n', cmPolicies::GetPolicyWarning(cmPolicies::CMP0140)));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      default:
        break;
    }
    if (args[0] != "PROPAGATE"_s) {
      status.SetError(
        cmStrCat("called with unsupported argument \"", args[0], '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    status.SetReturnInvoked({ args.begin() + 1, args.end() });
  } else {
    status.SetReturnInvoked();
  }
  return true;
}